

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall
SQVM::ArithMetaMethod(SQVM *this,SQInteger op,SQObjectPtr *o1,SQObjectPtr *o2,SQObjectPtr *dest)

{
  long *plVar1;
  byte bVar2;
  SQChar *pSVar3;
  SQChar *pSVar4;
  SQSharedState *in_RDX;
  SQObjectPtr *in_RSI;
  SQVM *in_RDI;
  bool bVar5;
  SQObjectPtr closure;
  SQMetaMethod mm;
  SQObjectPtr *in_stack_ffffffffffffff68;
  SQVM *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  SQMetaMethod mm_00;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  SQVM *this_00;
  undefined4 local_34;
  SQSharedState *local_20;
  SQObjectPtr *local_18;
  byte local_1;
  
  mm_00 = (SQMetaMethod)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  switch(in_RSI) {
  case (SQObjectPtr *)0x25:
    local_34 = 5;
    break;
  default:
    local_34 = 0;
    break;
  case (SQObjectPtr *)0x2a:
    local_34 = 2;
    break;
  case (SQObjectPtr *)0x2b:
    local_34 = 0;
    break;
  case (SQObjectPtr *)0x2d:
    local_34 = 1;
    break;
  case (SQObjectPtr *)0x2f:
    local_34 = 3;
  }
  local_18 = in_RSI;
  if ((((ulong)in_RDX->_metamethods & 0x2000000) != 0) &&
     (*(long *)(*(long *)&(in_RDX->_metamethodsmap).super_SQObject + 0x30) != 0)) {
    this_00 = (SQVM *)&stack0xffffffffffffffb8;
    local_20 = in_RDX;
    ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)this_00);
    plVar1 = *(long **)&(local_20->_metamethodsmap).super_SQObject;
    bVar2 = (**(code **)(*plVar1 + 0x30))(plVar1,in_RDI,local_34,this_00);
    bVar5 = (bVar2 & 1) != 0;
    if (bVar5) {
      Push(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      Push(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      local_1 = CallMetaMethod(this_00,(SQObjectPtr *)
                                       CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80)
                               ,mm_00,(SQInteger)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68
                              );
    }
    ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff70);
    if (bVar5) goto LAB_00142ca5;
  }
  pSVar3 = GetTypeName((SQObjectPtr *)0x142c6e);
  pSVar4 = GetTypeName((SQObjectPtr *)0x142c7d);
  Raise_Error(in_RDI,"arith op %c on between \'%s\' and \'%s\'",local_18,pSVar3,pSVar4);
  local_1 = 0;
LAB_00142ca5:
  return (bool)(local_1 & 1);
}

Assistant:

bool SQVM::ArithMetaMethod(SQInteger op,const SQObjectPtr &o1,const SQObjectPtr &o2,SQObjectPtr &dest)
{
    SQMetaMethod mm;
    switch(op){
        case _SC('+'): mm=MT_ADD; break;
        case _SC('-'): mm=MT_SUB; break;
        case _SC('/'): mm=MT_DIV; break;
        case _SC('*'): mm=MT_MUL; break;
        case _SC('%'): mm=MT_MODULO; break;
        default: mm = MT_ADD; assert(0); break; //shutup compiler
    }
    if(is_delegable(o1) && _delegable(o1)->_delegate) {

        SQObjectPtr closure;
        if(_delegable(o1)->GetMetaMethod(this, mm, closure)) {
            Push(o1);Push(o2);
            return CallMetaMethod(closure,mm,2,dest);
        }
    }
    Raise_Error(_SC("arith op %c on between '%s' and '%s'"),op,GetTypeName(o1),GetTypeName(o2));
    return false;
}